

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::ld_hl_sp_d8(SM83 *this)

{
  ushort uVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_signed_char_&>
  fmt;
  char *in_stack_ffffffffffffffc0;
  u32 result;
  u8 local_11;
  SM83 *pSStack_10;
  s8 value;
  SM83 *this_local;
  
  pSStack_10 = this;
  local_11 = GetByteFromPC(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x50;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,signed_char&>
            ((v11 *)
             "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  LD HL, SP+0x{:02X}\n",fmt
             ,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)&local_11,in_stack_ffffffffffffffc0);
  uVar1 = this->sp + (short)(char)local_11;
  SetZeroFlag(this,false);
  SetNegateFlag(this,false);
  SetHalfCarryFlag(this,((this->sp ^ (short)(char)local_11 ^ uVar1) & 0x10) == 0x10);
  SetCarryFlag(this,((this->sp ^ (short)(char)local_11 ^ uVar1) & 0x100) == 0x100);
  (this->field_3).hl = uVar1;
  Timer::AdvanceCycles(this->timer,4);
  return;
}

Assistant:

void SM83::ld_hl_sp_d8() {
    s8 value = static_cast<s8>(GetByteFromPC());
    LTRACE("LD HL, SP+0x{:02X}", value);

    u32 result = sp + value;

    SetZeroFlag(false);
    SetNegateFlag(false);
    SetHalfCarryFlag(((sp ^ value ^ (result & 0xFFFF)) & 0x10) == 0x10);
    SetCarryFlag(((sp ^ value ^ (result & 0xFFFF)) & 0x100) == 0x100);

    hl = static_cast<u16>(result);

    timer.AdvanceCycles(4);
}